

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeTBLInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar3]);
  if ((Insn & 0x40) != 0) {
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar3]);
  }
  uVar2 = Insn >> 0x10 & 0xf | Insn >> 3 & 0x10;
  uVar3 = MCInst_getOpcode(Inst);
  if ((uVar3 != 0x8a9) && (uVar3 != 0x8a3)) {
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar2]);
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[Insn >> 1 & 0x10 | Insn & 0xf]);
    return MCDisassembler_Success;
  }
  uVar3 = 0;
  if (uVar2 != 0x1f) {
    MCOperand_CreateReg0(Inst,(uint)DPairDecoderTable[uVar2]);
    uVar3 = 3;
  }
  DVar1 = (*(code *)((long)&DAT_001d4780 + (long)(int)(&DAT_001d4780)[uVar3]))();
  return DVar1;
}

Assistant:

static DecodeStatus DecodeTBLInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, op;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 7, 1) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	Rm |= fieldFromInstruction_4(Insn, 5, 1) << 4;
	op = fieldFromInstruction_4(Insn, 6, 1);

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (op) {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail; // Writeback
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VTBL2:
		case ARM_VTBX2:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}